

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantNet::get_conv_weight_blob_scales(QuantNet *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  float *pfVar7;
  long in_RDI;
  double dVar8;
  int i_3;
  float max_value_2;
  float *data_n_2;
  Mat weight_data_n_2;
  int n_2;
  vector<float,_std::allocator<float>_> scales_2;
  int weight_data_size_output_2;
  string name_2;
  int i_2;
  float max_value_1;
  float *data_n_1;
  Mat weight_data_n_1;
  int n_1;
  vector<float,_std::allocator<float>_> scales_1;
  int weight_data_size_output_1;
  string name_1;
  int i_1;
  float max_value;
  float *data_n;
  Mat weight_data_n;
  int n;
  int stride_h;
  int stride_w;
  int dilation_h;
  int dilation_w;
  int kernel_h;
  int kernel_w;
  bool quant_6bit;
  vector<float,_std::allocator<float>_> scales;
  int weight_data_size_output;
  string name;
  Layer *layer;
  size_t i;
  mapped_type *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd7c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd80;
  key_type *in_stack_fffffffffffffda8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *in_stack_fffffffffffffdb0;
  float local_224;
  int local_220;
  float local_21c;
  vector<float,_std::allocator<float>_> *local_218;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe08;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe10;
  int local_1cc;
  string local_1a8 [32];
  float local_188;
  float local_184;
  int local_180;
  float local_17c;
  float *local_178;
  Mat local_170;
  int local_12c;
  int local_10c;
  string local_108 [36];
  float local_e4;
  float local_e0;
  float local_dc;
  int local_d8;
  float local_d4;
  float *local_d0;
  Mat local_b8;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  byte local_59;
  int local_3c;
  string local_38 [32];
  value_type local_18;
  ulong local_10;
  
  for (local_10 = 0; uVar3 = local_10,
      sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40)),
      uVar3 < sVar5; local_10 = local_10 + 1) {
    ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         local_10);
    local_18 = *ppLVar6;
    bVar4 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    if (bVar4) {
      std::__cxx11::string::string(local_38,(string *)&local_18->name);
      local_3c = *(int *)&local_18[1].name.field_0x4 / *(int *)&local_18[1]._vptr_Layer;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x113f50);
      local_59 = 0;
      local_60 = *(int *)((long)&local_18[1]._vptr_Layer + 4);
      local_64._0_1_ = local_18[1].one_blob_only;
      local_64._1_1_ = local_18[1].support_inplace;
      local_64._2_1_ = local_18[1].support_vulkan;
      local_64._3_1_ = local_18[1].support_packing;
      local_68 = local_18[1].typeindex;
      local_6c = *(int *)&local_18[1].type;
      local_70 = *(int *)&local_18[1].type.field_0x4;
      local_74 = (int)local_18[1].type._M_string_length;
      if ((((local_60 == 3) && (local_64 == 3)) && (local_68 == 1)) &&
         (((local_6c == 1 && (local_70 == 1)) && (local_74 == 1)))) {
        local_59 = 1;
      }
      for (local_78 = 0; local_78 < *(int *)&local_18[1]._vptr_Layer; local_78 = local_78 + 1) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                         (int)in_stack_fffffffffffffd70);
        local_d0 = ncnn::Mat::operator_cast_to_float_(&local_b8);
        local_d4 = std::numeric_limits<float>::min();
        for (local_d8 = 0; local_d8 < local_3c; local_d8 = local_d8 + 1) {
          dVar8 = std::fabs((double)(ulong)(uint)local_d0[local_d8]);
          local_dc = SUB84(dVar8,0);
          in_stack_fffffffffffffdb0 =
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)std::max<float>(&local_d4,&local_dc);
          local_d4 = *(float *)&(in_stack_fffffffffffffdb0->_M_t)._M_impl;
        }
        if ((local_59 & 1) == 0) {
          local_e4 = 127.0 / local_d4;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
                     (value_type_conflict *)in_stack_fffffffffffffd68);
        }
        else {
          local_e0 = 31.0 / local_d4;
          std::vector<float,_std::allocator<float>_>::push_back
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
                     (value_type_conflict *)in_stack_fffffffffffffd68);
        }
        ncnn::Mat::~Mat((Mat *)0x1141f8);
      }
      in_stack_fffffffffffffda8 =
           (key_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::vector<float,_std::allocator<float>_>::operator=
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_38);
    }
    bVar4 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    if (bVar4) {
      std::__cxx11::string::string(local_108,(string *)&local_18->name);
      local_10c = *(int *)&local_18[1].name.field_0x4 / (int)local_18[1].name._M_string_length;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1142e8);
      for (local_12c = 0; local_12c < (int)local_18[1].name._M_string_length;
          local_12c = local_12c + 1) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                         (int)in_stack_fffffffffffffd70);
        local_178 = ncnn::Mat::operator_cast_to_float_(&local_170);
        local_17c = std::numeric_limits<float>::min();
        for (local_180 = 0; local_180 < local_10c; local_180 = local_180 + 1) {
          dVar8 = std::fabs((double)(ulong)(uint)local_178[local_180]);
          local_184 = SUB84(dVar8,0);
          pfVar7 = std::max<float>(&local_17c,&local_184);
          local_17c = *pfVar7;
        }
        local_188 = 127.0 / local_17c;
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
                   (value_type_conflict *)in_stack_fffffffffffffd68);
        ncnn::Mat::~Mat((Mat *)0x114483);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::vector<float,_std::allocator<float>_>::operator=
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_108);
    }
    bVar4 = std::operator==(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    if (bVar4) {
      std::__cxx11::string::string(local_1a8,(string *)&local_18->name);
      iVar1 = *(int *)&local_18[1].one_blob_only;
      iVar2 = *(int *)&local_18[1]._vptr_Layer;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x114573);
      for (local_1cc = 0; local_1cc < *(int *)&local_18[1]._vptr_Layer; local_1cc = local_1cc + 1) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                         (int)in_stack_fffffffffffffd70);
        in_stack_fffffffffffffd80 =
             (vector<float,_std::allocator<float>_> *)
             ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffdf0);
        local_218 = in_stack_fffffffffffffd80;
        local_21c = std::numeric_limits<float>::min();
        for (local_220 = 0; local_220 < iVar1 / iVar2; local_220 = local_220 + 1) {
          dVar8 = std::fabs((double)(ulong)(uint)*(float *)((long)&(local_218->
                                                                                                                                      
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  (long)local_220 * 4));
          in_stack_fffffffffffffd7c = SUB84(dVar8,0);
          local_224 = in_stack_fffffffffffffd7c;
          in_stack_fffffffffffffd70 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::max<float>(&local_21c,&local_224);
          local_21c = *(float *)in_stack_fffffffffffffd70;
        }
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
                   (value_type_conflict *)in_stack_fffffffffffffd68);
        ncnn::Mat::~Mat((Mat *)0x1146e4);
      }
      in_stack_fffffffffffffd68 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
           ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      std::vector<float,_std::allocator<float>_>::operator=
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_1a8);
    }
  }
  return 0;
}

Assistant:

int QuantNet::get_conv_weight_blob_scales()
{
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        
        if (layer->type == "Convolution")
        {
            std::string name = layer->name;
            const int weight_data_size_output = ((ncnn::Convolution*)layer)->weight_data_size / ((ncnn::Convolution*)layer)->num_output;
            std::vector<float> scales;

            // int8 winograd F43 needs weight data to use 6bit quantization
            bool quant_6bit = false;
            int kernel_w = ((ncnn::Convolution*)layer)->kernel_w;
            int kernel_h = ((ncnn::Convolution*)layer)->kernel_h;
            int dilation_w = ((ncnn::Convolution*)layer)->dilation_w;
            int dilation_h = ((ncnn::Convolution*)layer)->dilation_h;
            int stride_w = ((ncnn::Convolution*)layer)->stride_w;
            int stride_h = ((ncnn::Convolution*)layer)->stride_h;

            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                quant_6bit = true;

            for (int n=0; n<((ncnn::Convolution*)layer)->num_output; n++)
            {
                const ncnn::Mat weight_data_n = ((ncnn::Convolution*)layer)->weight_data.range(weight_data_size_output * n, weight_data_size_output);
                const float *data_n = weight_data_n;
                float max_value = std::numeric_limits<float>::min();

                for (int i = 0; i < weight_data_size_output; i++)
                    max_value = std::max(max_value, std::fabs(data_n[i]));

                if (quant_6bit)
                    scales.push_back(31 / max_value);
                else
                    scales.push_back(127 / max_value);
            }

            weight_scales[name] = scales;
        }
        
        if (layer->type == "ConvolutionDepthWise")
        {
            std::string name = layer->name;
            const int weight_data_size_output = ((ncnn::ConvolutionDepthWise*)layer)->weight_data_size / ((ncnn::ConvolutionDepthWise*)layer)->group;
            std::vector<float> scales;

            for (int n=0; n<((ncnn::ConvolutionDepthWise*)layer)->group; n++)
            {
                const ncnn::Mat weight_data_n = ((ncnn::ConvolutionDepthWise*)layer)->weight_data.range(weight_data_size_output * n, weight_data_size_output);
                const float *data_n = weight_data_n;
                float max_value = std::numeric_limits<float>::min();

                for (int i = 0; i < weight_data_size_output; i++)
                    max_value = std::max(max_value, std::fabs(data_n[i]));

                scales.push_back(127 / max_value); 
            }

            weight_scales[name] = scales;                
        }

        if (layer->type == "InnerProduct")
        {
            std::string name = layer->name;
            const int weight_data_size_output = ((ncnn::InnerProduct*)layer)->weight_data_size / ((ncnn::InnerProduct*)layer)->num_output;
            std::vector<float> scales;

            for (int n=0; n<((ncnn::InnerProduct*)layer)->num_output; n++)
            {
                const ncnn::Mat weight_data_n = ((ncnn::InnerProduct*)layer)->weight_data.range(weight_data_size_output * n, weight_data_size_output);
                const float *data_n = weight_data_n;
                float max_value = std::numeric_limits<float>::min();

                for (int i = 0; i < weight_data_size_output; i++)
                    max_value = std::max(max_value, std::fabs(data_n[i]));

                scales.push_back(127 / max_value);
            }

            weight_scales[name] = scales;            
        }
    }              

    return 0;
}